

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O3

Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
* __thiscall
capnp::compiler::Compiler::Node::resolveMember
          (Maybe<kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>_>
           *__return_storage_ptr__,Node *this,StringPtr name)

{
  undefined4 uVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  uint64_t uVar4;
  _Rb_tree_color _Var5;
  iterator iVar6;
  iterator iVar7;
  key_type local_30;
  Resolver local_20;
  
  local_30.content.size_ = name.content.size_;
  local_30.content.ptr = name.content.ptr;
  if ((this->isBuiltin != true) &&
     (getContent((Node *)&stack0xffffffffffffffe0,(State)this),
     local_20._vptr_Resolver != (_func_int **)0x0)) {
    iVar6 = std::
            _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
            ::find((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Node,_std::nullptr_t>_>_>_>
                    *)(local_20._vptr_Resolver + 1),&local_30);
    if (iVar6._M_node != (_Base_ptr)(local_20._vptr_Resolver + 2)) {
      p_Var2 = iVar6._M_node[1]._M_right;
      p_Var3 = p_Var2[2]._M_parent;
      uVar1 = *(undefined4 *)&p_Var2[3].field_0x4;
      uVar4 = this->id;
      _Var5 = p_Var2[3]._M_color;
      (__return_storage_ptr__->ptr).isSet = true;
      (__return_storage_ptr__->ptr).field_1.value.tag = 1;
      *(_Base_ptr *)((long)&(__return_storage_ptr__->ptr).field_1 + 8) = p_Var3;
      *(undefined4 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x10) = uVar1;
      *(uint64_t *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x18) = uVar4;
      *(short *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x20) = (short)_Var5;
      *(_Base_ptr *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x28) = p_Var2;
      *(undefined1 *)((long)&(__return_storage_ptr__->ptr).field_1 + 0x30) = 0;
      return __return_storage_ptr__;
    }
    iVar7 = std::
            _Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
            ::find((_Rb_tree<kj::StringPtr,_std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>,_std::_Select1st<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>,_std::less<kj::StringPtr>,_std::allocator<std::pair<const_kj::StringPtr,_kj::Own<capnp::compiler::Compiler::Alias,_std::nullptr_t>_>_>_>
                    *)(local_20._vptr_Resolver + 0xb),&local_30);
    if (iVar7._M_node != (_Base_ptr)(local_20._vptr_Resolver + 0xc)) {
      Alias::compile(__return_storage_ptr__,(Alias *)iVar7._M_node[1]._M_right);
      return __return_storage_ptr__;
    }
  }
  (__return_storage_ptr__->ptr).isSet = false;
  return __return_storage_ptr__;
}

Assistant:

kj::Maybe<Resolver::ResolveResult>
Compiler::Node::resolveMember(kj::StringPtr name) {
  if (isBuiltin) return kj::none;

  KJ_IF_SOME(content, getContent(Content::EXPANDED)) {
    {
      auto iter = content.nestedNodes.find(name);
      if (iter != content.nestedNodes.end()) {
        Node* node = iter->second;
        ResolveResult result;
        result.init<ResolvedDecl>(ResolvedDecl {
            node->id, node->genericParamCount, id, node->kind, node, kj::none });
        return result;
      }
    }
    {
      auto iter = content.aliases.find(name);
      if (iter != content.aliases.end()) {
        return iter->second->compile();
      }
    }
  }
  return kj::none;
}